

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O1

bool __thiscall
solitaire::events::EventsProcessor::tryAddCardOnTableauPileAndCheckIfHandEmpty
          (EventsProcessor *this,PileId *id,MouseLeftButtonUpEventData *eventData)

{
  (*eventData->solitaire->_vptr_Solitaire[9])();
  return (eventData->cardsInHand->
         super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
         _M_impl.super__Vector_impl_data._M_start ==
         (eventData->cardsInHand->
         super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool EventsProcessor::tryAddCardOnTableauPileAndCheckIfHandEmpty(
    const PileId id, const MouseLeftButtonUpEventData& eventData) const
{
    eventData.solitaire.tryAddCardsOnTableauPile(id);
    return eventData.cardsInHand.empty();
}